

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O2

Vec_Int_t * Glucose_SolverFromAig(Gia_Man_t *p,SimpSolver *s)

{
  vec<Gluco::Lit> *ps;
  int **ppiVar1;
  Cnf_Dat_t *p_00;
  int **ppiVar2;
  Vec_Int_t *pVVar3;
  abctime aVar4;
  abctime time;
  int *piVar5;
  long lVar6;
  Lit local_3c;
  abctime local_38;
  
  local_38 = Abc_Clock();
  ps = &(s->super_Solver).user_lits;
  lVar6 = 0;
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,1,0,0);
  while (lVar6 < p_00->nClauses) {
    if (ps->data != (Lit *)0x0) {
      (s->super_Solver).user_lits.sz = 0;
    }
    ppiVar2 = p_00->pClauses;
    ppiVar1 = ppiVar2 + lVar6;
    lVar6 = lVar6 + 1;
    for (piVar5 = *ppiVar1; piVar5 < ppiVar2[lVar6]; piVar5 = piVar5 + 1) {
      local_3c.x = *piVar5;
      Gluco::vec<Gluco::Lit>::push(ps,&local_3c);
      Gluco::SimpSolver::addVar(s,*piVar5 >> 1);
      ppiVar2 = p_00->pClauses;
    }
    Gluco::SimpSolver::addClause(s,ps);
  }
  pVVar3 = Vec_IntAllocArrayCopy(p_00->pVarNums,p_00->nVars);
  printf("CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ",(ulong)(uint)p_00->nVars,
         (ulong)(uint)p_00->nClauses,(ulong)(uint)p_00->nLiterals);
  aVar4 = Abc_Clock();
  Abc_PrintTime(0x816bba,(char *)(aVar4 - local_38),time);
  Cnf_DataFree(p_00);
  return pVVar3;
}

Assistant:

Vec_Int_t * Glucose_SolverFromAig( Gia_Man_t * p, SimpSolver& s )
{
    abctime clk = Abc_Clock();
    vec<Lit> * lits = &s.user_lits;
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8 /*nLutSize*/, 0 /*fCnfObjIds*/, 1/*fAddOrCla*/, 0, 0/*verbose*/ );
    for ( int i = 0; i < pCnf->nClauses; i++ )
    {
        lits->clear();
        for ( int * pLit = pCnf->pClauses[i]; pLit < pCnf->pClauses[i+1]; pLit++ )
            lits->push( toLit(*pLit) ), s.addVar( *pLit >> 1 );
        s.addClause(*lits);
    }
    Vec_Int_t * vCnfIds = Vec_IntAllocArrayCopy(pCnf->pVarNums,pCnf->nVars);
    printf( "CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ", pCnf->nVars, pCnf->nClauses, pCnf->nLiterals );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Cnf_DataFree(pCnf);
    return vCnfIds;
}